

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall Adjacency_Subgraph_data_Test::TestBody(Adjacency_Subgraph_data_Test *this)

{
  _Head_base<0UL,_unsigned_long_*,_false> *this_00;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar1;
  __tuple_element_t<0UL,_tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>_>
  *ppuVar2;
  char *pcVar3;
  __tuple_element_t<1UL,_tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>_>
  *ppuVar4;
  __tuple_element_t<2UL,_tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>_>
  *ppuVar5;
  __tuple_element_t<3UL,_tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>_>
  *ppuVar6;
  AssertHelper local_500;
  Message local_4f8;
  void *local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_15;
  Message local_4d0;
  void *local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_14;
  Message local_4a8;
  void *local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_13;
  Message local_480;
  void *local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_12;
  allocator<unsigned_long> local_439;
  unsigned_long local_438 [3];
  iterator local_420;
  size_type local_418;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_410;
  Adjacency_Subgraph local_3f8;
  AssertHelper local_390;
  Message local_388;
  void *local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_11;
  Message local_360;
  void *local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_10;
  Message local_338;
  void *local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_9;
  Message local_310;
  void *local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_8;
  allocator<unsigned_long> local_2c9;
  unsigned_long local_2c8 [4];
  iterator local_2a8;
  size_type local_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  Adjacency_Subgraph local_280;
  undefined1 local_218 [8];
  Adjacency_Graph<false> graph;
  Message local_1e0;
  void *local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_7;
  Message local_1b8;
  void *local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_6;
  Message local_190;
  void *local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_5;
  Message local_168;
  void *local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_4;
  Message local_140;
  void *local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  void *local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  void *local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8 [3];
  void *local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> data;
  Adjacency_Subgraph subgraph;
  Adjacency_Subgraph_data_Test *this_local;
  
  this_00 = &data.
             super__Tuple_impl<0UL,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
             .super__Head_base<0UL,_unsigned_long_*,_false>;
  Disa::Adjacency_Subgraph::Adjacency_Subgraph((Adjacency_Subgraph *)this_00);
  Disa::Adjacency_Subgraph::data
            ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
             &gtest_ar.message_,(Adjacency_Subgraph *)this_00);
  ppuVar2 = std::get<0ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_b0 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_a8,"std::get<0>(data)","nullptr",ppuVar2,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  ppuVar4 = std::get<1ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_e8 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_e0,"std::get<1>(data)","nullptr",ppuVar4,&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  ppuVar5 = std::get<2ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_110 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_108,"std::get<2>(data)","nullptr",ppuVar5,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xb0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  ppuVar6 = std::get<3ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_138 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_130,"std::get<3>(data)","nullptr",ppuVar6,&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xb1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  Disa::Adjacency_Subgraph::resize
            ((Adjacency_Subgraph *)
             &data.
              super__Tuple_impl<0UL,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
              .super__Head_base<0UL,_unsigned_long_*,_false>,4);
  ppuVar2 = std::get<0ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_160 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_158,"std::get<0>(data)","nullptr",ppuVar2,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  ppuVar4 = std::get<1ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_188 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_180,"std::get<1>(data)","nullptr",ppuVar4,&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xb5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  ppuVar5 = std::get<2ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_1b0 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_1a8,"std::get<2>(data)","nullptr",ppuVar5,&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xb6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  ppuVar6 = std::get<3ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_1d8 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_1d0,"std::get<3>(data)","nullptr",ppuVar6,&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  Disa::create_graph_saad();
  local_2c8[0] = 0;
  local_2c8[1] = 8;
  local_2c8[2] = 6;
  local_2a8 = local_2c8;
  local_2a0 = 3;
  std::allocator<unsigned_long>::allocator(&local_2c9);
  __l_00._M_len = local_2a0;
  __l_00._M_array = local_2a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_298,__l_00,&local_2c9);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_280,(Adjacency_Graph<false> *)local_218,&local_298,0);
  Disa::Adjacency_Subgraph::operator=
            ((Adjacency_Subgraph *)
             &data.
              super__Tuple_impl<0UL,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
              .super__Head_base<0UL,_unsigned_long_*,_false>,&local_280);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_280);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_298);
  std::allocator<unsigned_long>::~allocator(&local_2c9);
  Disa::Adjacency_Subgraph::data
            ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
             &gtest_ar_8.message_,
             (Adjacency_Subgraph *)
             &data.
              super__Tuple_impl<0UL,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
              .super__Head_base<0UL,_unsigned_long_*,_false>);
  std::tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>::operator=
            ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
             &gtest_ar.message_,(type)&gtest_ar_8.message_);
  ppuVar2 = std::get<0ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_308 = (void *)0x0;
  testing::internal::CmpHelperNE<unsigned_long*,decltype(nullptr)>
            ((internal *)local_300,"std::get<0>(data)","nullptr",ppuVar2,&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  ppuVar4 = std::get<1ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_330 = (void *)0x0;
  testing::internal::CmpHelperNE<unsigned_long*,decltype(nullptr)>
            ((internal *)local_328,"std::get<1>(data)","nullptr",ppuVar4,&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  ppuVar5 = std::get<2ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_358 = (void *)0x0;
  testing::internal::CmpHelperNE<unsigned_long*,decltype(nullptr)>
            ((internal *)local_350,"std::get<2>(data)","nullptr",ppuVar5,&local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xbf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  ppuVar6 = std::get<3ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_380 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_long_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_378,"std::get<3>(data)","nullptr",ppuVar6,&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xc0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_438[0] = 0;
  local_438[1] = 8;
  local_438[2] = 6;
  local_420 = local_438;
  local_418 = 3;
  std::allocator<unsigned_long>::allocator(&local_439);
  __l._M_len = local_418;
  __l._M_array = local_420;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_410,__l,&local_439);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_3f8,(Adjacency_Graph<false> *)local_218,&local_410,1);
  Disa::Adjacency_Subgraph::operator=
            ((Adjacency_Subgraph *)
             &data.
              super__Tuple_impl<0UL,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
              .super__Head_base<0UL,_unsigned_long_*,_false>,&local_3f8);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_3f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_410);
  std::allocator<unsigned_long>::~allocator(&local_439);
  Disa::Adjacency_Subgraph::data
            ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
             &gtest_ar_12.message_,
             (Adjacency_Subgraph *)
             &data.
              super__Tuple_impl<0UL,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
              .super__Head_base<0UL,_unsigned_long_*,_false>);
  std::tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>::operator=
            ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
             &gtest_ar.message_,(type)&gtest_ar_12.message_);
  ppuVar2 = std::get<0ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_478 = (void *)0x0;
  testing::internal::CmpHelperNE<unsigned_long*,decltype(nullptr)>
            ((internal *)local_470,"std::get<0>(data)","nullptr",ppuVar2,&local_478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xc5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  ppuVar4 = std::get<1ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_4a0 = (void *)0x0;
  testing::internal::CmpHelperNE<unsigned_long*,decltype(nullptr)>
            ((internal *)local_498,"std::get<1>(data)","nullptr",ppuVar4,&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xc6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  ppuVar5 = std::get<2ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_4c8 = (void *)0x0;
  testing::internal::CmpHelperNE<unsigned_long*,decltype(nullptr)>
            ((internal *)local_4c0,"std::get<2>(data)","nullptr",ppuVar5,&local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,199,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  ppuVar6 = std::get<3ul,unsigned_long*,unsigned_long*,unsigned_long*,unsigned_long*>
                      ((tuple<unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*> *)
                       &gtest_ar.message_);
  local_4f0 = (void *)0x0;
  testing::internal::CmpHelperNE<unsigned_long*,decltype(nullptr)>
            ((internal *)local_4e8,"std::get<3>(data)","nullptr",ppuVar6,&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_218);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph
            ((Adjacency_Subgraph *)
             &data.
              super__Tuple_impl<0UL,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
              .super__Head_base<0UL,_unsigned_long_*,_false>);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, data) {

  Adjacency_Subgraph subgraph;

  // Empty subgraph.
  auto data = subgraph.data();
  EXPECT_EQ(std::get<0>(data), nullptr);
  EXPECT_EQ(std::get<1>(data), nullptr);
  EXPECT_EQ(std::get<2>(data), nullptr);
  EXPECT_EQ(std::get<3>(data), nullptr);

  subgraph.resize(4);  // we have no edges yet, so the vertex list remains a nullptr.
  EXPECT_EQ(std::get<0>(data), nullptr);
  EXPECT_EQ(std::get<1>(data), nullptr);
  EXPECT_EQ(std::get<2>(data), nullptr);
  EXPECT_EQ(std::get<3>(data), nullptr);

  // Create a subgraph, but with no levels.
  Adjacency_Graph graph = create_graph_saad();
  subgraph = Adjacency_Subgraph(graph, {0, 8, 6});
  data = subgraph.data();
  EXPECT_NE(std::get<0>(data), nullptr);
  EXPECT_NE(std::get<1>(data), nullptr);
  EXPECT_NE(std::get<2>(data), nullptr);
  EXPECT_EQ(std::get<3>(data), nullptr);  // there are no levels

  // Create a subgraph with levels.
  subgraph = Adjacency_Subgraph(graph, {0, 8, 6}, 1);
  data = subgraph.data();
  EXPECT_NE(std::get<0>(data), nullptr);
  EXPECT_NE(std::get<1>(data), nullptr);
  EXPECT_NE(std::get<2>(data), nullptr);
  EXPECT_NE(std::get<3>(data), nullptr);
}